

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O3

int __thiscall amrex::MultiCutFab::remove(MultiCutFab *this,char *__filename)

{
  int iVar1;
  int extraout_EAX;
  BaseFab<double> *this_00;
  MFIter mfi;
  MFIter local_80;
  
  MFIter::MFIter(&local_80,(FabArrayBase *)this,'\0');
  if (local_80.currentIndex < local_80.endIndex) {
    do {
      iVar1 = local_80.currentIndex;
      if (local_80.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar1 = ((local_80.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[local_80.currentIndex];
      }
      if (*(int *)&((this->m_cellflags->m_fabs_v).
                    super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar1]->
                   super_BaseFab<amrex::EBCellFlag>).field_0x44 != 1) {
        this_00 = (BaseFab<double> *)FabArray<amrex::CutFab>::release(&this->m_data,&local_80);
        if (this_00 != (BaseFab<double> *)0x0) {
          this_00->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
          BaseFab<double>::clear(this_00);
        }
        operator_delete(this_00,0x48);
      }
      MFIter::operator++(&local_80);
    } while (local_80.currentIndex < local_80.endIndex);
  }
  MFIter::~MFIter(&local_80);
  return extraout_EAX;
}

Assistant:

void
MultiCutFab::remove ()
{
    for (MFIter mfi(m_data); mfi.isValid(); ++mfi)
    {
        if (!ok(mfi))
        {
            delete m_data.release(mfi);
        }
    }
}